

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

int userkey_parse_line_counter(char *text)

{
  uint uVar1;
  ulong uVar2;
  char *endptr;
  char *local_10;
  
  uVar2 = strtoul(text,&local_10,10);
  if (*text == '\0') {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = 0xffffffff;
    if (uVar2 < 0x1555) {
      uVar1 = (uint)uVar2;
    }
    uVar1 = -(uint)(*local_10 != '\0') | uVar1;
  }
  return uVar1;
}

Assistant:

static int userkey_parse_line_counter(const char *text)
{
    char *endptr;
    unsigned long ul = strtoul(text, &endptr, 10);
    if (*text && !*endptr && ul < MAX_KEY_BLOB_LINES)
        return ul;
    else
        return -1;
}